

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O1

Chars * sentencepiece::normalizer::anon_unknown_1::Normalize
                  (Chars *__return_storage_ptr__,CharsMap *chars_map,Chars *src,int max_len)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  void *pvVar2;
  ostream *poVar3;
  pointer puVar4;
  const_iterator cVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint *__args;
  ulong uVar9;
  Chars key;
  allocator_type local_59;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_58;
  Die local_50;
  undefined7 uStack_4f;
  long local_48;
  long local_40;
  long local_38;
  
  local_58.container = __return_storage_ptr__;
  if (max_len < 1) {
    local_50.die_ = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"builder.cc",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(max_len) >= (1)",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    error::Die::~Die(&local_50);
  }
  ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 2;
    p_Var1 = &(chars_map->_M_t)._M_impl.super__Rb_tree_header;
    local_38 = (long)max_len;
    uVar9 = 0;
    do {
      uVar8 = local_38 + uVar9;
      if (uVar7 < local_38 + uVar9) {
        uVar8 = uVar7;
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_50,
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar4 + uVar9),
                 (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar4 + uVar8),&local_59);
      cVar5._M_node = &p_Var1->_M_header;
      if (CONCAT71(uStack_4f,local_50.die_) != local_48) {
        do {
          cVar5 = std::
                  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::find(&chars_map->_M_t,(key_type *)&local_50);
          if ((_Rb_tree_header *)cVar5._M_node != p_Var1) break;
          local_48 = local_48 + -4;
        } while (CONCAT71(uStack_4f,local_50.die_) != local_48);
      }
      if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
        __args = (src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar9;
        __position._M_current =
             ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_58.container,
                     __position,__args);
        }
        else {
          *__position._M_current = *__args;
          ((local_58.container)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar9 = uVar9 + 1;
      }
      else {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (&(cVar5._M_node[1]._M_right)->_M_color,*(uint **)(cVar5._M_node + 2),local_58);
        uVar9 = uVar9 + ((long)cVar5._M_node[1]._M_parent - *(long *)(cVar5._M_node + 1) >> 2);
      }
      pvVar2 = (void *)CONCAT71(uStack_4f,local_50.die_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_40 - (long)pvVar2);
      }
      puVar4 = (src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
    } while (uVar9 < uVar7);
  }
  return local_58.container;
}

Assistant:

Builder::Chars Normalize(const Builder::CharsMap &chars_map,
                         const Builder::Chars &src, int max_len) {
  CHECK_GE(max_len, 1);
  Builder::Chars normalized;

  for (size_t i = 0; i < src.size();) {
    Builder::CharsMap::const_iterator it = chars_map.end();
    const size_t slice = std::min<size_t>(i + max_len, src.size());
    // starts with the longest prefix.
    Builder::Chars key(src.begin() + i, src.begin() + slice);
    while (!key.empty()) {
      it = chars_map.find(key);
      if (it != chars_map.end()) {
        break;
      }
      key.pop_back();  // remove the last character.
    }

    // Consumes one character when no rule is found.
    if (it == chars_map.end()) {
      normalized.push_back(src[i]);
      ++i;
    } else {
      std::copy(it->second.begin(), it->second.end(),
                std::back_inserter(normalized));
      i += it->first.size();
    }
  }

  return normalized;
}